

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O0

bool iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>::validate
               (size_t buffer_size,FLAT_FORWARD_LIST_TEST *e)

{
  size_t sVar1;
  FLAT_FORWARD_LIST_TEST *e_local;
  size_t buffer_size_local;
  
  if (e->NextEntryOffset == 0) {
    sVar1 = get_size(e);
    buffer_size_local._7_1_ = sVar1 <= buffer_size;
  }
  else if (buffer_size < e->NextEntryOffset) {
    buffer_size_local._7_1_ = false;
  }
  else {
    sVar1 = get_size(e);
    buffer_size_local._7_1_ = sVar1 <= e->NextEntryOffset;
  }
  return buffer_size_local._7_1_;
}

Assistant:

static bool validate(size_t buffer_size, FLAT_FORWARD_LIST_TEST const &e) noexcept {
            //
            // if this is last element then make sure it fits in the reminder of buffer
            // otherwise make sure that pointer to the next element fits reminder of buffer
            // and this element size fits before next element starts
            //
            // Note that when we evaluate if buffer is valid we are not requiring
            // that it is properly aligned. An implementation can choose to enforce 
            // that
            //
            //
            if (e.NextEntryOffset == 0) {
                return  get_size(e) <= buffer_size;
            } else if (e.NextEntryOffset <= buffer_size) {
                return  get_size(e) <= e.NextEntryOffset;
            }
            return false;
        }